

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

void __thiscall wasm::IRBuilder::push(IRBuilder *this,Expression *expr)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  ScopeCtx *pSVar4;
  mapped_type *pmVar5;
  Expression *local_28;
  Expression *expr_local;
  
  local_28 = expr;
  pSVar4 = getScope(this);
  if ((expr->type).id == 1) {
    pSVar4->unreachable = true;
  }
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
            (&pSVar4->exprStack,&local_28);
  applyDebugLoc(this,local_28);
  if ((this->binaryPos != (size_t *)0x0) && (this->func != (Function *)0x0)) {
    sVar2 = this->lastBinaryPos;
    sVar3 = *this->binaryPos;
    if (sVar2 != sVar3) {
      iVar1 = (int)this->codeSectionOffset;
      pmVar5 = std::__detail::
               _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->func->expressionLocations,&local_28);
      pmVar5->start = (int)sVar2 - iVar1;
      pmVar5->end = (int)sVar3 - iVar1;
      this->lastBinaryPos = *this->binaryPos;
    }
  }
  return;
}

Assistant:

void IRBuilder::push(Expression* expr) {
  auto& scope = getScope();
  if (expr->type == Type::unreachable) {
    scope.unreachable = true;
  }
  scope.exprStack.push_back(expr);

  applyDebugLoc(expr);
  if (binaryPos && func && lastBinaryPos != *binaryPos) {
    func->expressionLocations[expr] =
      BinaryLocations::Span{BinaryLocation(lastBinaryPos - codeSectionOffset),
                            BinaryLocation(*binaryPos - codeSectionOffset)};
    lastBinaryPos = *binaryPos;
  }

  DBG(std::cerr << "After pushing " << ShallowExpression{expr} << ":\n");
  DBG(dump());
}